

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::PortDeathTest_ProtobufAssume_Test::PortDeathTest_ProtobufAssume_Test
          (PortDeathTest_ProtobufAssume_Test *this)

{
  PortDeathTest_ProtobufAssume_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__PortDeathTest_ProtobufAssume_Test_029e26d0;
  return;
}

Assistant:

TEST(PortDeathTest, ProtobufAssume) {
  PROTOBUF_ASSUME(assume_var_for_test == 1);
#ifdef GTEST_HAS_DEATH_TEST
#if defined(NDEBUG)
  // If NDEBUG is defined, then instead of reliably crashing, the code below
  // will assume a false statement. This is undefined behavior which will trip
  // up sanitizers.
  GTEST_SKIP() << "Can't test PROTOBUF_ASSUME()";
#else
  EXPECT_DEBUG_DEATH(
      PROTOBUF_ASSUME(assume_var_for_test == 2),
      "port_test\\.cc:.*Assumption failed: 'assume_var_for_test == 2'");
#endif
#endif
}